

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-context.c
# Opt level: O2

_Bool cmd_menu(command_list *list,void *selection_p)

{
  cmd_info_conflict *pcVar1;
  int iVar2;
  _Bool _Var3;
  uint uVar4;
  size_t sVar5;
  ui_event_type uVar6;
  ui_event uVar7;
  region area;
  menu_iter commands_menu;
  menu menu;
  
  commands_menu.resize = (_func_void_menu_ptr *)0x0;
  commands_menu.display_row = cmd_sub_entry;
  commands_menu.row_handler = (_func__Bool_menu_ptr_ui_event_ptr_int *)0x0;
  commands_menu.get_tag = (_func_char_menu_ptr_int *)0x0;
  commands_menu.valid_row = (_func_int_menu_ptr_int *)0x0;
  area.col = 0x17;
  area.row = 4;
  area.width = 0x25;
  area.page_rows = 0xd;
  menu_init(&menu,MN_SKIN_SCROLL,&commands_menu);
  menu_setpriv(&menu,(int)list->len,list->list);
  iVar2 = list->menu_level;
  area.col = iVar2 * 2 + 0x17;
  area.row = 4 - iVar2;
  if (2 < iVar2) {
    __assert_fail("area.row > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-context.c"
                  ,0x493,"_Bool cmd_menu(struct command_list *, void *)");
  }
  menu_layout(&menu,&area);
  screen_save();
  window_make(area.col + L'\xfffffffe',area.row + L'\xffffffff',area.col + L'\'',area.row + L'\r');
  while( true ) {
    while( true ) {
      uVar7 = menu_select(&menu,0,true);
      uVar6 = uVar7.type;
      if (uVar6 == EVT_SELECT) break;
      if (uVar6 == EVT_ESCAPE) {
        if ((1 < screen_save_depth) && ((1 < tile_width || (1 < tile_height)))) {
          screen_load_all();
          goto LAB_001b422c;
        }
        goto LAB_001b4227;
      }
    }
    pcVar1 = list->list + menu.cursor;
    if ((list->list[menu.cursor].cmd != CMD_NULL) || (pcVar1->hook != (_func_void *)0x0)) break;
    uVar4 = pcVar1->nested_cached_idx;
    if (uVar4 == 0xffffffff) {
      sVar5 = cmd_list_lookup_by_name(pcVar1->nested_name);
      uVar4 = (uint)sVar5;
      list->list[menu.cursor].nested_cached_idx = uVar4;
    }
    if (((int)uVar4 < 0) || (_Var3 = cmd_menu(cmds_all + uVar4,selection_p), !_Var3))
    goto LAB_001b4227;
  }
  *(cmd_info_conflict **)selection_p = pcVar1;
LAB_001b4227:
  screen_load();
LAB_001b422c:
  return uVar6 != EVT_SELECT;
}

Assistant:

static bool cmd_menu(struct command_list *list, void *selection_p)
{
	struct menu menu;
	menu_iter commands_menu = { NULL, NULL, cmd_sub_entry, NULL, NULL };
	region area = { 23, 4, 37, 13 };

	ui_event evt;
	struct cmd_info **selection = selection_p;
	/*
	 * By default, cause the containing menu to break out of its event
	 * handling when this function returns.
	 */
	bool result = false;

	/* Set up the menu */
	menu_init(&menu, MN_SKIN_SCROLL, &commands_menu);
	menu_setpriv(&menu, list->len, list->list);
	area.col += 2 * list->menu_level;
	area.row -= list->menu_level;
	assert(area.row > 1);
	menu_layout(&menu, &area);

	/* Set up the screen */
	screen_save();
	window_make(area.col - 2, area.row - 1, area.col + 39, area.row + 13);

	while (1) {
		/* Select an entry */
		evt = menu_select(&menu, 0, true);

		if (evt.type == EVT_SELECT) {
			if (list->list[menu.cursor].cmd ||
					list->list[menu.cursor].hook) {
				/* It's a proper command. */
				*selection = &list->list[menu.cursor];
				break;
			} else {
				/*
				 * It's a placeholder that's a parent for a
				 * nested menu.
				 */
				/*
				 * Look up the list of commands for the nested
				 * menu.
				 */
				if (list->list[menu.cursor].nested_cached_idx == -1) {
					list->list[menu.cursor].nested_cached_idx =
						cmd_list_lookup_by_name(list->list[menu.cursor].nested_name);
				}
				if (list->list[menu.cursor].nested_cached_idx >= 0) {
					/* Display a menu for it. */
					if (!cmd_menu(&cmds_all[list->list[menu.cursor].nested_cached_idx], selection_p)) {
						break;
					}
				} else {
					break;
				}
			}
		} else if (evt.type == EVT_ESCAPE) {
			/*
			 * Return to the containing menu and don't break out all
			 * the way to main game loop.
			 */
			result = true;
			break;
		}
	}

	/*
	 * Load the screen.  Do a more expensive update if not breaking out
	 * all the way from the menus and there may be partially overwritten
	 * big tiles.
	 */
	if (result && screen_save_depth > 1
			&& (tile_width > 1 || tile_height > 1)) {
		screen_load_all();
	} else {
		screen_load();
	}

	return result;
}